

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmstrbuf.cpp
# Opt level: O0

vm_strbuf_ext * vm_strbuf_ext::alloc_ext(CVmObjStringBuffer *self,int32_t alo,int32_t inc)

{
  int iVar1;
  CVmVarHeap *pCVar2;
  undefined4 extraout_var;
  int32_t in_EDX;
  int in_ESI;
  undefined8 in_RDI;
  vm_strbuf_ext *ext;
  int32_t siz;
  vm_strbuf_ext *pvVar3;
  
  pCVar2 = CVmMemory::get_var_heap(G_mem_X);
  iVar1 = (*pCVar2->_vptr_CVmVarHeap[4])(pCVar2,(long)((in_ESI + -1) * 4 + 0x10),in_RDI);
  pvVar3 = (vm_strbuf_ext *)CONCAT44(extraout_var,iVar1);
  pvVar3->alo = in_ESI;
  pvVar3->inc = in_EDX;
  pvVar3->len = 0;
  return pvVar3;
}

Assistant:

vm_strbuf_ext *vm_strbuf_ext::alloc_ext(VMG_ CVmObjStringBuffer *self,
                                        int32_t alo, int32_t inc)
{
    /* calculate how much space we need */
    int32_t siz = sizeof(vm_strbuf_ext) + (alo-1)*sizeof(wchar_t);

    /* allocate the memory */
    vm_strbuf_ext *ext = (vm_strbuf_ext *)G_mem->get_var_heap()->alloc_mem(
        siz, self);

    /* remember the sizes */
    ext->alo = alo;
    ext->inc = inc;

    /* the buffer is currently empty */
    ext->len = 0;

    /* return the new extension */
    return ext;
}